

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcJunctionBoxType::~IfcJunctionBoxType(IfcJunctionBoxType *this)

{
  ~IfcJunctionBoxType((IfcJunctionBoxType *)
                      &this[-1].super_IfcFlowFittingType.super_IfcDistributionFlowElementType.
                       super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.
                       super_IfcTypeObject.field_0x48);
  return;
}

Assistant:

IfcJunctionBoxType() : Object("IfcJunctionBoxType") {}